

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa_hotplug.c
# Opt level: O0

int device_list_size(void)

{
  void *pvVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  void *pvVar5;
  size_t sVar6;
  void *pvVar7;
  ulong uVar8;
  undefined8 uStack_90;
  void *local_88;
  void *local_80;
  int local_74;
  int local_70;
  int hasCapture;
  int hasPlayback;
  uint count;
  char name [32];
  snd_pcm_info_t *pcminfo;
  snd_ctl_card_info_t *info;
  int nb;
  int idx;
  int dev;
  int err;
  int card;
  snd_ctl_t *handle;
  
  info._4_4_ = 0;
  uStack_90 = 0x11f107;
  lVar4 = snd_ctl_card_info_sizeof();
  lVar4 = -(lVar4 + 0xfU & 0xfffffffffffffff0);
  pvVar5 = (void *)((long)&local_88 + lVar4);
  local_80 = pvVar5;
  *(undefined8 *)((long)&uStack_90 + lVar4) = 0x11f12c;
  sVar6 = snd_ctl_card_info_sizeof();
  pvVar1 = local_80;
  *(undefined8 *)((long)&uStack_90 + lVar4) = 0x11f13a;
  memset(pvVar1,0,sVar6);
  *(undefined8 *)((long)&uStack_90 + lVar4) = 0x11f141;
  lVar4 = snd_pcm_info_sizeof();
  pvVar7 = (void *)((long)pvVar5 - (lVar4 + 0xfU & 0xfffffffffffffff0));
  local_88 = pvVar7;
  *(undefined8 *)((long)pvVar7 + -8) = 0x11f166;
  sVar6 = snd_pcm_info_sizeof();
  pvVar1 = local_88;
  *(undefined8 *)((long)pvVar7 + -8) = 0x11f174;
  memset(pvVar1,0,sVar6);
  dev = -1;
  *(undefined8 *)((long)pvVar7 + -8) = 0x11f184;
  iVar3 = snd_card_next(&dev);
  if ((iVar3 < 0) || (dev < 0)) {
    handle._4_4_ = 0;
  }
  else {
    do {
      if (dev < 0) break;
      uVar8 = (ulong)(uint)dev;
      *(undefined8 *)((long)pvVar7 + -8) = 0x11f1bb;
      sprintf((char *)&hasPlayback,"hw:%d",uVar8);
      *(undefined8 *)((long)pvVar7 + -8) = 0x11f1ca;
      idx = snd_ctl_open(&err,&hasPlayback,0);
      uVar2 = _err;
      if (-1 < idx) {
        *(undefined8 *)((long)pvVar7 + -8) = 0x11f1e4;
        idx = snd_ctl_card_info(uVar2,pvVar5);
        uVar2 = _err;
        if (idx < 0) {
          *(undefined8 *)((long)pvVar7 + -8) = 0x11f1f5;
          snd_ctl_close(uVar2);
        }
        else {
          nb = -1;
          while( true ) {
            uVar2 = _err;
            local_70 = 0;
            local_74 = 0;
            *(undefined8 *)((long)pvVar7 + -8) = 0x11f21c;
            snd_ctl_pcm_next_device(uVar2,&nb);
            uVar2 = _err;
            iVar3 = nb;
            if (nb < 0) break;
            *(undefined8 *)((long)pvVar7 + -8) = 0x11f233;
            snd_pcm_info_set_device(pvVar7,iVar3);
            *(undefined8 *)((long)pvVar7 + -8) = 0x11f23e;
            snd_pcm_info_set_subdevice(pvVar7,0);
            *(undefined8 *)((long)pvVar7 + -8) = 0x11f24c;
            snd_pcm_info_set_stream(pvVar7,1);
            uVar2 = _err;
            *(undefined8 *)((long)pvVar7 + -8) = 0x11f259;
            idx = snd_ctl_pcm_info(uVar2,pvVar7);
            if (-1 < idx) {
              local_74 = 1;
            }
            *(undefined8 *)((long)pvVar7 + -8) = 0x11f273;
            snd_pcm_info_set_stream(pvVar7,0);
            uVar2 = _err;
            *(undefined8 *)((long)pvVar7 + -8) = 0x11f280;
            idx = snd_ctl_pcm_info(uVar2,pvVar7);
            if (-1 < idx) {
              local_70 = 1;
              *(undefined8 *)((long)pvVar7 + -8) = 0x11f298;
              hasCapture = snd_pcm_info_get_subdevices_count(pvVar7);
            }
            if ((local_70 != 0) || (local_74 != 0)) {
              info._4_4_ = info._4_4_ + 1;
            }
          }
          *(undefined8 *)((long)pvVar7 + -8) = 0x11f2c3;
          snd_ctl_close(uVar2);
        }
      }
      *(undefined8 *)((long)pvVar7 + -8) = 0x11f2cc;
      iVar3 = snd_card_next(&dev);
    } while (-1 < iVar3);
    handle._4_4_ = info._4_4_;
  }
  return handle._4_4_;
}

Assistant:

static int device_list_size(void)
{
  snd_ctl_t *handle;
  int card, err, dev, idx;
  int nb = 0;
  snd_ctl_card_info_t *info;
  snd_pcm_info_t *pcminfo;
  snd_ctl_card_info_alloca(&info);
  snd_pcm_info_alloca(&pcminfo);

  card = -1;
  if (snd_card_next(&card) < 0 || card < 0)
  {
    return nb;
  }

  while (card >= 0)
  {
    char name[32];

    sprintf(name, "hw:%d", card);
    if ((err = snd_ctl_open(&handle, name, 0)) < 0)
    {
      goto next_card;
    }
    if ((err = snd_ctl_card_info(handle, info)) < 0)
    {
      snd_ctl_close(handle);
      goto next_card;
    }
    dev = -1;
    while (1)
    {
      unsigned int count;
      int hasPlayback = 0;
      int hasCapture = 0;

      snd_ctl_pcm_next_device(handle, &dev);

      if (dev < 0)
        break;
      snd_pcm_info_set_device(pcminfo, dev);
      snd_pcm_info_set_subdevice(pcminfo, 0);
      snd_pcm_info_set_stream(pcminfo, SND_PCM_STREAM_CAPTURE);
      if ((err = snd_ctl_pcm_info(handle, pcminfo)) >= 0)
      {
        hasCapture = 1;
      }

      snd_pcm_info_set_stream(pcminfo, SND_PCM_STREAM_PLAYBACK);
      if ((err = snd_ctl_pcm_info(handle, pcminfo)) >= 0)
      {
        hasPlayback = 1;

        count = snd_pcm_info_get_subdevices_count(pcminfo);
      }

      if(hasPlayback == 0 && hasCapture == 0)
        continue;

      nb++;
    }
    snd_ctl_close(handle);
next_card:
    if (snd_card_next(&card) < 0)
    {
      break;
    }
  }
  return nb;
}